

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void art_shrink_at(art_t *art,art_ref_t ref)

{
  int iVar1;
  art_ref_t aVar2;
  long lVar3;
  uint8_t i;
  long lVar4;
  ulong uVar5;
  
  if ((ref & 0xff) != 1) {
    iVar1 = (int)(ref & 0xff);
    switch((uint)ref & 0xff) {
    case 2:
      lVar3 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + (ulong)(uint)(iVar1 << 3)) +
              *(long *)((long)art->nodes + (ulong)(uint)(iVar1 << 3));
      for (uVar5 = 0; uVar5 < *(byte *)(lVar3 + 6); uVar5 = uVar5 + 1) {
        aVar2 = art_move_node_to_shrink(art,*(art_ref_t *)(lVar3 + 0x10 + uVar5 * 8));
        *(art_ref_t *)(lVar3 + 0x10 + uVar5 * 8) = aVar2;
        art_shrink_at(art,aVar2);
      }
      break;
    case 3:
      lVar3 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + (ulong)(uint)(iVar1 << 3)) +
              *(long *)((long)art->nodes + (ulong)(uint)(iVar1 << 3));
      for (uVar5 = 0; uVar5 < *(byte *)(lVar3 + 6); uVar5 = uVar5 + 1) {
        aVar2 = art_move_node_to_shrink(art,*(art_ref_t *)(lVar3 + 0x18 + uVar5 * 8));
        *(art_ref_t *)(lVar3 + 0x18 + uVar5 * 8) = aVar2;
        art_shrink_at(art,aVar2);
      }
      break;
    case 4:
      lVar3 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + (ulong)(uint)(iVar1 << 3)) +
              *(long *)((long)art->nodes + (ulong)(uint)(iVar1 << 3));
      for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
        uVar5 = (ulong)*(byte *)(lVar3 + 0x10 + lVar4);
        if (uVar5 != 0x30) {
          aVar2 = art_move_node_to_shrink(art,*(art_ref_t *)(lVar3 + 0x110 + uVar5 * 8));
          *(art_ref_t *)(lVar3 + 0x110 + uVar5 * 8) = aVar2;
          art_shrink_at(art,aVar2);
        }
      }
      break;
    case 5:
      lVar3 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + (ulong)(uint)(iVar1 << 3)) +
              *(long *)((long)art->nodes + (ulong)(uint)(iVar1 << 3)) + 8;
      for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
        aVar2 = *(art_ref_t *)(lVar3 + lVar4 * 8);
        if (aVar2 != 0) {
          aVar2 = art_move_node_to_shrink(art,aVar2);
          *(art_ref_t *)(lVar3 + lVar4 * 8) = aVar2;
          art_shrink_at(art,aVar2);
        }
      }
    }
  }
  return;
}

Assistant:

static void art_shrink_at(art_t *art, art_ref_t ref) {
    if (art_is_leaf(ref)) {
        return;
    }
    switch (art_ref_typecode(ref)) {
        case CROARING_ART_NODE4_TYPE: {
            art_node4_t *node4 = (art_node4_t *)art_deref(art, ref);
            for (uint8_t i = 0; i < node4->count; ++i) {
                node4->children[i] =
                    art_move_node_to_shrink(art, node4->children[i]);
                art_shrink_at(art, node4->children[i]);
            }
        } break;
        case CROARING_ART_NODE16_TYPE: {
            art_node16_t *node16 = (art_node16_t *)art_deref(art, ref);
            for (uint8_t i = 0; i < node16->count; ++i) {
                node16->children[i] =
                    art_move_node_to_shrink(art, node16->children[i]);
                art_shrink_at(art, node16->children[i]);
            }
        } break;
        case CROARING_ART_NODE48_TYPE: {
            art_node48_t *node48 = (art_node48_t *)art_deref(art, ref);
            for (int i = 0; i < 256; ++i) {
                if (node48->keys[i] != CROARING_ART_NODE48_EMPTY_VAL) {
                    uint8_t idx = node48->keys[i];
                    node48->children[idx] =
                        art_move_node_to_shrink(art, node48->children[idx]);
                    art_shrink_at(art, node48->children[idx]);
                }
            }
        } break;
        case CROARING_ART_NODE256_TYPE: {
            art_node256_t *node256 = (art_node256_t *)art_deref(art, ref);
            for (int i = 0; i < 256; ++i) {
                if (node256->children[i] != CROARING_ART_NULL_REF) {
                    node256->children[i] =
                        art_move_node_to_shrink(art, node256->children[i]);
                    art_shrink_at(art, node256->children[i]);
                }
            }
        } break;
        default:
            assert(false);
            break;
    }
}